

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::previous(BreakCache *this,UErrorCode *status)

{
  uint uVar1;
  RuleBasedBreakIterator *pRVar2;
  uint uVar3;
  int32_t iVar4;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  uVar1 = this->fBufIdx;
  if (uVar1 == this->fStartBufIdx) {
    populatePreceding(this,status);
    iVar4 = this->fTextIdx;
    uVar3 = this->fBufIdx;
  }
  else {
    uVar3 = uVar1 - 1 & 0x7f;
    this->fBufIdx = uVar3;
    iVar4 = this->fBoundaries[uVar3];
    this->fTextIdx = iVar4;
  }
  pRVar2 = this->fBI;
  pRVar2->fDone = uVar3 == uVar1;
  pRVar2->fPosition = iVar4;
  pRVar2->fRuleStatusIndex = (uint)this->fStatuses[(int)uVar3];
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }